

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_test.cc
# Opt level: O2

void xLearn::read_from_memory(string *filename,int task_id)

{
  bool has_label;
  int iVar1;
  uint uVar2;
  DMatrix *matrix;
  InmemReader in_mem_reader;
  InmemReader local_190;
  
  InmemReader::InmemReader(&local_190);
  InmemReader::Initialize(&local_190,filename);
  uVar2 = 0;
  do {
    while( true ) {
      if (9 < uVar2) {
        InmemReader::~InmemReader(&local_190);
        return;
      }
      iVar1 = (*local_190.super_Reader._vptr_Reader[4])(&local_190);
      if (iVar1 != 0) break;
      (*local_190.super_Reader._vptr_Reader[5])(&local_190);
    }
    has_label = true;
    switch(task_id) {
    case 2:
      CheckCSV((DMatrix *)0x0,false);
      break;
    case 3:
      has_label = false;
    case 0:
      CheckLR((DMatrix *)0x0,has_label,false);
      break;
    case 4:
      has_label = false;
    case 1:
      CheckFFM((DMatrix *)0x0,has_label,false);
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

void read_from_memory(const std::string& filename, int task_id) {
  InmemReader in_mem_reader;
  Reader* reader = nullptr;
  in_mem_reader.Initialize(filename);
  reader = &in_mem_reader;
  DMatrix* matrix = nullptr;
  for (int i = 0; i < iteration_num; ++i) {
    int record_num = reader->Samples(matrix);
    if (record_num == 0) {
      --i;
      reader->Reset();
      continue;
    }
    switch (task_id) {
      case 0:
        CheckLR(matrix, true, false);
        break;
      case 1:
        CheckFFM(matrix, true, false);
        break;
      case 2:
        CheckCSV(matrix, false);
        break;
      case 3:
        CheckLR(matrix, false, false);
        break;
      case 4:
        CheckFFM(matrix, false, false);
        break;
    }
  }
}